

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall
wasm::TranslateToFuzzReader::addHangLimitChecks(TranslateToFuzzReader *this,Function *func)

{
  Builder *this_00;
  Loop *pLVar1;
  Function *pFVar2;
  bool bVar3;
  Expression *pEVar4;
  Block *pBVar5;
  Expression *left;
  Const *right;
  Binary *pBVar6;
  _Storage<wasm::Type,_true> extraout_RDX;
  pointer ppLVar7;
  pointer ppLVar8;
  optional<wasm::Type> type;
  optional<wasm::Type> type_00;
  _Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_> local_50;
  Function *local_38;
  
  local_38 = func;
  FindAll<wasm::Loop>::FindAll((FindAll<wasm::Loop> *)&local_50,func->body);
  ppLVar7 = local_50._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->builder;
  for (ppLVar8 = local_50._M_impl.super__Vector_impl_data._M_start; ppLVar8 != ppLVar7;
      ppLVar8 = ppLVar8 + 1) {
    pLVar1 = *ppLVar8;
    pEVar4 = makeHangLimitCheck(this);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 1;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         (_Storage<wasm::Type,_true>)
         (pLVar1->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression.type.id;
    pBVar5 = Builder::makeSequence(this_00,pEVar4,pLVar1->body,type);
    pLVar1->body = (Expression *)pBVar5;
  }
  std::_Vector_base<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::~_Vector_base(&local_50);
  left = makeHangLimitCheck(this);
  pFVar2 = local_38;
  pEVar4 = local_38->body;
  wasm::HeapType::getSignature();
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = extraout_RDX;
  pBVar5 = Builder::makeSequence(this_00,left,pEVar4,type_00);
  pFVar2->body = (Expression *)pBVar5;
  FindAll<wasm::ArrayNew>::FindAll((FindAll<wasm::ArrayNew> *)&local_50,(Expression *)pBVar5);
  local_38 = (Function *)local_50._M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar7 = local_50._M_impl.super__Vector_impl_data._M_start; (Function *)ppLVar7 != local_38;
      ppLVar7 = ppLVar7 + 1) {
    pLVar1 = *ppLVar7;
    bVar3 = Random::oneIn(&this->random,100);
    if (!bVar3) {
      pEVar4 = (Expression *)(pLVar1->name).super_IString.str._M_str;
      right = Builder::makeConst<int>(this_00,0x3ff);
      pBVar6 = Builder::makeBinary(this_00,AndInt32,pEVar4,(Expression *)right);
      (pLVar1->name).super_IString.str._M_str = (char *)pBVar6;
    }
  }
  std::_Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_>::~_Vector_base
            ((_Vector_base<wasm::ArrayNew_*,_std::allocator<wasm::ArrayNew_*>_> *)&local_50);
  return;
}

Assistant:

void TranslateToFuzzReader::addHangLimitChecks(Function* func) {
  // loop limit
  for (auto* loop : FindAll<Loop>(func->body).list) {
    loop->body =
      builder.makeSequence(makeHangLimitCheck(), loop->body, loop->type);
  }
  // recursion limit
  func->body =
    builder.makeSequence(makeHangLimitCheck(), func->body, func->getResults());
  // ArrayNew can hang the fuzzer if the array size is massive. This doesn't
  // cause an OOM (which the fuzzer knows how to ignore) but it just works for
  // many seconds on building the array. To avoid that, limit the size with high
  // probability.
  for (auto* arrayNew : FindAll<ArrayNew>(func->body).list) {
    if (!oneIn(100)) {
      arrayNew->size = builder.makeBinary(
        AndInt32, arrayNew->size, builder.makeConst(int32_t(1024 - 1)));
    }
  }
}